

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

void __thiscall
chaiscript::parser::ChaiScript_Parser::build_match<chaiscript::eval::Case_AST_Node>
          (ChaiScript_Parser *this,size_t t_match_start,string *t_text)

{
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *this_00;
  element_type *peVar1;
  size_t sVar2;
  pointer psVar3;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  new_children;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  local_78;
  shared_ptr<chaiscript::AST_Node> local_58;
  Parse_Location local_48;
  
  this_00 = &this->m_match_stack;
  psVar3 = (this->m_match_stack).
           super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar2 = (long)(this->m_match_stack).
                super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4;
  local_48.filename.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (this->m_filename).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_48.filename.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (this->m_filename).
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (sVar2 == t_match_start) {
    if (local_48.filename.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.filename.
         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_48.filename.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48.filename.
         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_48.filename.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_48.start.line = (this->m_position).line;
    local_48.start.column = (this->m_position).col;
    local_48.end.line = local_48.start.line;
    local_48.end.column = local_48.start.column;
  }
  else {
    if (local_48.filename.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.filename.
         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_48.filename.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
        psVar3 = (this_00->
                 super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        (local_48.filename.
         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_48.filename.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    peVar1 = psVar3[t_match_start].
             super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48.start.line = (peVar1->location).start.line;
    local_48.start.column = *(int *)((long)&peVar1->location + 4);
    local_48.end.line = *(int *)&(this->m_position).m_pos._M_current;
    local_48.end.column = *(int *)((long)&(this->m_position).m_pos._M_current + 4);
  }
  local_78.
  super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (sVar2 != t_match_start) {
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
    ::
    _M_assign_aux<std::move_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::AST_Node>*,std::vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>>>>
              ((vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
                *)&local_78,
               (this->m_match_stack).
               super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (int)t_match_start,
               (this->m_match_stack).
               super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::_M_erase(this_00,(this->m_match_stack).
                       super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (int)t_match_start,
               (this->m_match_stack).
               super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  make_shared<chaiscript::AST_Node,chaiscript::eval::Case_AST_Node,std::__cxx11::string,chaiscript::Parse_Location,std::vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>>
            ((chaiscript *)&local_58,t_text,&local_48,&local_78);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
  ::emplace_back<std::shared_ptr<chaiscript::AST_Node>>
            ((vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
              *)this_00,&local_58);
  if (local_58.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::~vector(&local_78);
  if (local_48.filename.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.filename.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void build_match(size_t t_match_start, std::string t_text = "") {
        bool is_deep = false;

        Parse_Location filepos = [&]()->Parse_Location{ 
          //so we want to take everything to the right of this and make them children
          if (t_match_start != m_match_stack.size()) {
            is_deep = true;
            return Parse_Location(
                m_filename,
                m_match_stack[t_match_start]->location.start.line,
                m_match_stack[t_match_start]->location.start.column,
                m_position.line,
                m_position.col 
              );
          } else {
            return Parse_Location(
                m_filename,
                m_position.line,
                m_position.col,
                m_position.line,
                m_position.col
              );
          }
        }();

        std::vector<AST_NodePtr> new_children;

        if (is_deep) {
          new_children.assign(std::make_move_iterator(m_match_stack.begin() + static_cast<int>(t_match_start)), 
                              std::make_move_iterator(m_match_stack.end()));
          m_match_stack.erase(m_match_stack.begin() + static_cast<int>(t_match_start), m_match_stack.end());
        }

        /// \todo fix the fact that a successful match that captured no ast_nodes doesn't have any real start position
        m_match_stack.push_back(
            chaiscript::make_shared<chaiscript::AST_Node, NodeType>(
              std::move(t_text),
              std::move(filepos),
              std::move(new_children)));
      }